

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

void __thiscall cfd::core::Script::SetStackData(Script *this,ByteData *bytedata)

{
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *this_00;
  byte bVar1;
  void *pvVar2;
  bool bVar3;
  pointer pSVar4;
  pointer pSVar5;
  uint uVar6;
  size_t sVar7;
  Script *__dest;
  int64_t value;
  long lVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  CfdException *pCVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  Script *pSVar15;
  size_t __n;
  Script *this_01;
  uint uVar16;
  uint uVar17;
  int iVar18;
  pointer puVar19;
  uint uVar20;
  allocator_type *int64_value;
  bool bVar21;
  initializer_list<cfd::core::ScriptType> __l;
  initializer_list<cfd::core::ScriptType> __l_00;
  initializer_list<cfd::core::ScriptType> __l_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> collect_buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  ScriptElement script_element;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> top_collect_buffer;
  int64_t values [5];
  ByteData byte_array;
  Script local_1a8;
  int local_16c;
  undefined1 local_168 [32];
  _Alloc_hider local_148;
  size_type sStack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [3];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  Script *local_d0;
  ulong local_c8;
  pointer local_c0;
  allocator_type local_b8 [40];
  ScriptElement local_90;
  
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &local_1a8.script_stack_,bytedata);
  if ((SetStackData(cfd::core::ByteData_const&)::kUseScriptNum1 == '\0') &&
     (iVar18 = __cxa_guard_acquire(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum1),
     iVar18 != 0)) {
    local_168._16_8_ = (_func_int **)0x900000008f;
    local_168._24_8_ = 0x9200000091;
    local_168._0_8_ = (Script *)0xb1000000b2;
    local_168._8_8_ = 0x8c0000008b;
    local_148._M_p = (pointer)0x7a00000079;
    __l._M_len = 10;
    __l._M_array = (iterator)local_168;
    ::std::
    set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
    ::set(&SetStackData::kUseScriptNum1,__l,(less<cfd::core::ScriptType> *)&local_90,local_b8);
    __cxa_atexit(::std::
                 set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
                 ::~set,&SetStackData::kUseScriptNum1,&__dso_handle);
    __cxa_guard_release(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum1);
  }
  if ((SetStackData(cfd::core::ByteData_const&)::kUseScriptNum2 == '\0') &&
     (iVar18 = __cxa_guard_acquire(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum2),
     iVar18 != 0)) {
    local_148._M_p = (pointer)0xa10000009a;
    sStack_140 = 0xa4000000a3;
    local_168._16_8_ = (_func_int **)0x9d0000009c;
    local_168._24_8_ = 0x9f0000009e;
    local_168._0_8_ = (Script *)0x9400000093;
    local_168._8_8_ = 0x9b000000a0;
    local_138[0]._M_allocated_capacity._0_4_ = 0xa2;
    __l_00._M_len = 0xd;
    __l_00._M_array = (iterator)local_168;
    ::std::
    set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
    ::set(&SetStackData::kUseScriptNum2,__l_00,(less<cfd::core::ScriptType> *)&local_90,local_b8);
    __cxa_atexit(::std::
                 set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
                 ::~set,&SetStackData::kUseScriptNum2,&__dso_handle);
    __cxa_guard_release(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum2);
  }
  if ((SetStackData(cfd::core::ByteData_const&)::kUseScriptNum3 == '\0') &&
     (iVar18 = __cxa_guard_acquire(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum3),
     iVar18 != 0)) {
    local_168._0_8_ = (Script *)0xba000000a5;
    __l_01._M_len = 2;
    __l_01._M_array = (iterator)local_168;
    ::std::
    set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
    ::set(&SetStackData::kUseScriptNum3,__l_01,(less<cfd::core::ScriptType> *)&local_90,local_b8);
    __cxa_atexit(::std::
                 set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
                 ::~set,&SetStackData::kUseScriptNum3,&__dso_handle);
    __cxa_guard_release(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum3);
  }
  local_1a8._vptr_Script = (_func_int **)0x0;
  local_1a8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&local_100,2,(allocator_type *)local_168);
  uVar12 = (long)local_1a8.script_stack_.
                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_1a8.script_stack_.
                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (uVar12 != 0) {
    this_00 = &this->script_stack_;
    uVar14 = 0;
    bVar3 = false;
    uVar6 = 0;
    do {
      uVar16 = (uint)uVar14;
      bVar1 = *(byte *)((long)&(local_1a8.script_stack_.
                                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_ScriptElement +
                       uVar14);
      if (bVar1 == 0) {
        ScriptElement::ScriptElement
                  ((ScriptElement *)local_168,(ScriptOperator *)ScriptOperator::OP_0);
        ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
        push_back(this_00,(ScriptElement *)local_168);
LAB_00414dc8:
        ScriptElement::~ScriptElement((ScriptElement *)local_168);
      }
      else {
        uVar17 = (uint)bVar1;
        if (bVar1 < 0x4c) {
          uVar16 = uVar16 + 1;
          bVar3 = true;
          uVar6 = uVar17;
        }
        else {
          uVar20 = (uint)bVar1;
          if (uVar20 == 0x4e) {
            uVar14 = (ulong)(uVar16 + 1) + 4;
            if (uVar12 <= uVar14) {
              local_168._0_8_ = "cfdcore_script.cpp";
              local_168._8_4_ = 0x372;
              local_168._16_8_ = "SetStackData";
              logger::log<>((CfdSourceLocation *)local_168,kCfdLogLevelWarning,
                            "OP_PUSHDATA4 is incorrect size.");
              pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
              local_168._0_8_ = local_168 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_168,"OP_PUSHDATA4 is incorrect size.","");
              CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_168);
              *(undefined ***)pCVar11 = &PTR__CfdException_006a6458;
              __cxa_throw(pCVar11,&InvalidScriptException::typeinfo,CfdException::~CfdException);
            }
            uVar6 = *(uint *)((long)&(local_1a8.script_stack_.
                                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                     _vptr_ScriptElement + (ulong)(uVar16 + 1));
          }
          else if (uVar20 == 0x4d) {
            uVar14 = (ulong)(uVar16 + 1) + 2;
            if (uVar12 <= uVar14) {
              local_168._0_8_ = "cfdcore_script.cpp";
              local_168._8_4_ = 0x365;
              local_168._16_8_ = "SetStackData";
              logger::log<>((CfdSourceLocation *)local_168,kCfdLogLevelWarning,
                            "OP_PUSHDATA2 is incorrect size.");
              pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
              local_168._0_8_ = local_168 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_168,"OP_PUSHDATA2 is incorrect size.","");
              CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_168);
              *(undefined ***)pCVar11 = &PTR__CfdException_006a6458;
              __cxa_throw(pCVar11,&InvalidScriptException::typeinfo,CfdException::~CfdException);
            }
            uVar6 = (uint)*(ushort *)
                           ((long)&(local_1a8.script_stack_.
                                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_vptr_ScriptElement
                           + (ulong)(uVar16 + 1));
          }
          else {
            if (uVar20 != 0x4c) {
              if (g_operator_map._40_8_ != 0) {
                lVar13 = 0x6ce198;
                if (g_operator_map._16_8_ != 0) {
                  lVar13 = 0x6ce198;
                  lVar8 = g_operator_map._16_8_;
                  do {
                    if ((int)uVar20 <= *(int *)(lVar8 + 0x20)) {
                      lVar13 = lVar8;
                    }
                    lVar8 = *(long *)(lVar8 + 0x10 +
                                     (ulong)(*(int *)(lVar8 + 0x20) < (int)uVar20) * 8);
                  } while (lVar8 != 0);
                }
                lVar8 = 0x6ce198;
                if ((lVar13 != 0x6ce198) && (lVar8 = lVar13, (int)uVar20 < *(int *)(lVar13 + 0x20)))
                {
                  lVar8 = 0x6ce198;
                }
                if (lVar8 != 0x6ce198) {
                  ScriptElement::ScriptElement
                            ((ScriptElement *)local_168,(ScriptOperator *)(lVar8 + 0x28));
                  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ::push_back(this_00,(ScriptElement *)local_168);
                  p_Var9 = &SetStackData::kUseScriptNum1._M_t._M_impl.super__Rb_tree_header.
                            _M_header;
                  if (SetStackData::kUseScriptNum1._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_parent != (_Base_ptr)0x0) {
                    p_Var9 = &SetStackData::kUseScriptNum1._M_t._M_impl.super__Rb_tree_header.
                              _M_header;
                    p_Var10 = SetStackData::kUseScriptNum1._M_t._M_impl.super__Rb_tree_header.
                              _M_header._M_parent;
                    do {
                      if ((int)uVar20 <= (int)p_Var10[1]._M_color) {
                        p_Var9 = p_Var10;
                      }
                      p_Var10 = (&p_Var10->_M_left)[(int)p_Var10[1]._M_color < (int)uVar20];
                    } while (p_Var10 != (_Base_ptr)0x0);
                  }
                  if (((_Rb_tree_header *)p_Var9 ==
                       &SetStackData::kUseScriptNum1._M_t._M_impl.super__Rb_tree_header) ||
                     ((int)uVar20 < (int)p_Var9[1]._M_color)) {
                    p_Var9 = &SetStackData::kUseScriptNum2._M_t._M_impl.super__Rb_tree_header.
                              _M_header;
                    if (SetStackData::kUseScriptNum2._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_parent != (_Base_ptr)0x0) {
                      p_Var9 = &SetStackData::kUseScriptNum2._M_t._M_impl.super__Rb_tree_header.
                                _M_header;
                      p_Var10 = SetStackData::kUseScriptNum2._M_t._M_impl.super__Rb_tree_header.
                                _M_header._M_parent;
                      do {
                        if ((int)uVar20 <= (int)p_Var10[1]._M_color) {
                          p_Var9 = p_Var10;
                        }
                        p_Var10 = (&p_Var10->_M_left)[(int)p_Var10[1]._M_color < (int)uVar20];
                      } while (p_Var10 != (_Base_ptr)0x0);
                    }
                    if (((_Rb_tree_header *)p_Var9 ==
                         &SetStackData::kUseScriptNum2._M_t._M_impl.super__Rb_tree_header) ||
                       ((int)uVar20 < (int)p_Var9[1]._M_color)) {
                      p_Var9 = &SetStackData::kUseScriptNum3._M_t._M_impl.super__Rb_tree_header.
                                _M_header;
                      if (SetStackData::kUseScriptNum3._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent != (_Base_ptr)0x0) {
                        p_Var9 = &SetStackData::kUseScriptNum3._M_t._M_impl.super__Rb_tree_header.
                                  _M_header;
                        p_Var10 = SetStackData::kUseScriptNum3._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent;
                        do {
                          if ((int)uVar17 <= (int)p_Var10[1]._M_color) {
                            p_Var9 = p_Var10;
                          }
                          p_Var10 = (&p_Var10->_M_left)[(int)p_Var10[1]._M_color < (int)uVar17];
                        } while (p_Var10 != (_Base_ptr)0x0);
                      }
                      puVar19 = (pointer)0x0;
                      bVar21 = true;
                      if (((_Rb_tree_header *)p_Var9 !=
                           &SetStackData::kUseScriptNum3._M_t._M_impl.super__Rb_tree_header) &&
                         ((int)p_Var9[1]._M_color <= (int)uVar17)) {
                        bVar21 = (ulong)(((long)(this->script_stack_).
                                                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->script_stack_).
                                                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 5) *
                                        -0x5555555555555555) < 4;
                        puVar19 = (pointer)(ulong)((uint)!bVar21 * 3);
                      }
                    }
                    else {
                      bVar21 = (ulong)(((long)(this->script_stack_).
                                              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->script_stack_).
                                              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 5) *
                                      -0x5555555555555555) < 3;
                      puVar19 = (pointer)(ulong)((uint)!bVar21 * 2);
                    }
                  }
                  else {
                    bVar21 = (ulong)(((long)(this->script_stack_).
                                            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->script_stack_).
                                            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5) *
                                    -0x5555555555555555) < 2;
                    puVar19 = (pointer)(ulong)!bVar21;
                  }
                  if (!bVar21) {
                    local_16c = (int)((ulong)((long)(this->script_stack_).
                                                                                                        
                                                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(this->script_stack_).
                                                                                                      
                                                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5) *
                                -0x55555555;
                    local_1a8.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = puVar19;
                    local_d0 = this;
                    if ((uint)puVar19 == 0) {
                      uVar17 = 0;
                    }
                    else {
                      uVar20 = ~(uint)puVar19 + local_16c;
                      uVar17 = 0;
                      int64_value = local_b8;
                      do {
                        bVar21 = ScriptElement::ConvertBinaryToNumber
                                           ((this_00->
                                            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar20,
                                            (int64_t *)int64_value);
                        uVar17 = uVar17 + bVar21;
                        int64_value = int64_value + 8;
                        uVar20 = uVar20 + 1;
                        puVar19 = puVar19 + -1;
                      } while (puVar19 != (pointer)0x0);
                    }
                    this = local_d0;
                    if ((uVar17 == (uint)local_1a8.script_data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage) &&
                       ((uint)local_1a8.script_data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage != 0)) {
                      local_c0 = (this_00->
                                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                      local_c8 = (ulong)local_1a8.script_data_.data_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage &
                                 0xffffffff;
                      iVar18 = ~(uint)local_1a8.script_data_.data_.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + local_16c
                      ;
                      uVar12 = 0;
                      do {
                        ScriptElement::ScriptElement(&local_90,*(int64_t *)(local_b8 + uVar12 * 8));
                        ScriptElement::operator=(local_c0 + (uint)((int)uVar12 + iVar18),&local_90);
                        ScriptElement::~ScriptElement(&local_90);
                        uVar12 = uVar12 + 1;
                      } while (local_c8 != uVar12);
                    }
                  }
                  goto LAB_00414dc8;
                }
              }
              goto LAB_00414e35;
            }
            uVar14 = (ulong)(uVar16 + 2);
            if (uVar12 <= uVar14) {
              local_168._0_8_ = "cfdcore_script.cpp";
              local_168._8_4_ = 0x35a;
              local_168._16_8_ = "SetStackData";
              logger::log<>((CfdSourceLocation *)local_168,kCfdLogLevelWarning,
                            "OP_PUSHDATA1 is incorrect size.");
              pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
              local_168._0_8_ = local_168 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_168,"OP_PUSHDATA1 is incorrect size.","");
              CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_168);
              *(undefined ***)pCVar11 = &PTR__CfdException_006a6458;
              __cxa_throw(pCVar11,&InvalidScriptException::typeinfo,CfdException::~CfdException);
            }
            uVar6 = (uint)*(byte *)((long)&(local_1a8.script_stack_.
                                            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                           _vptr_ScriptElement + (ulong)(uVar16 + 1));
          }
          bVar3 = true;
          uVar16 = (uint)uVar14;
        }
      }
LAB_00414e35:
      uVar17 = 1;
      if (bVar3) {
        if ((_func_int **)
            local_1a8.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != local_1a8._vptr_Script) {
          local_1a8.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1a8._vptr_Script;
        }
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a8,(ulong)uVar6)
        ;
        uVar17 = uVar6;
        if ((ulong)((long)local_1a8.script_stack_.
                          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1a8.script_stack_.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_start) < (ulong)(uVar16 + uVar6)) {
          if ((((ulong)(((long)(this->script_stack_).
                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->script_stack_).
                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555
                       ) < 2) ||
              (sVar7 = ByteData::GetDataSize
                                 (local_100.
                                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                  ._M_impl.super__Vector_impl_data._M_start), sVar7 != 3)) ||
             (sVar7 = ByteData::GetDataSize
                                (local_100.
                                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1),
             pSVar5 = local_1a8.script_stack_.
                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
             pSVar4 = local_1a8.script_stack_.
                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                      ._M_impl.super__Vector_impl_data._M_start, sVar7 != 4)) {
            local_168._0_8_ = "cfdcore_script.cpp";
            local_168._8_4_ = 0x3c2;
            local_168._16_8_ = "SetStackData";
            logger::log<>((CfdSourceLocation *)local_168,kCfdLogLevelWarning,
                          "buffer is incorrect size.");
            pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
            local_168._0_8_ = local_168 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_168,"buffer is incorrect size.","");
            CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_168);
            *(undefined ***)pCVar11 = &PTR__CfdException_006a6458;
            __cxa_throw(pCVar11,&InvalidScriptException::typeinfo,CfdException::~CfdException);
          }
          local_168._0_8_ = "cfdcore_script.cpp";
          local_168._8_4_ = 0x3c0;
          local_168._16_8_ = "SetStackData";
          logger::log<>((CfdSourceLocation *)local_168,kCfdLogLevelWarning,
                        "This script is coinbase scriptsig?");
          uVar17 = ((int)pSVar5 - (int)pSVar4) - uVar16;
        }
        lVar13 = (long)&(local_1a8.script_stack_.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vptr_ScriptElement +
                 (ulong)uVar16;
        this_01 = &local_1a8;
        ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1a8,lVar13,
                   lVar13 + (ulong)uVar17);
        uVar12 = ((long)local_100.
                        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_100.
                        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        lVar13 = (long)(this->script_stack_).
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->script_stack_).
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        if ((ulong)(lVar13 * -0x5555555555555555) <= uVar12 &&
            uVar12 + lVar13 * 0x5555555555555555 != 0) {
          ByteData::ByteData((ByteData *)local_168,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a8);
          lVar13 = (long)(this->script_stack_).
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->script_stack_).
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2;
          pvVar2 = *(void **)((long)&((local_100.
                                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->data_).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar13);
          *(undefined8 *)
           ((long)&((local_100.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_start)->data_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar13) = local_168._0_8_;
          *(undefined8 *)
           ((long)&((local_100.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_start)->data_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish + lVar13) = local_168._8_8_;
          *(undefined8 *)
           ((long)&((local_100.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_start)->data_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + lVar13) = local_168._16_8_;
          local_168._0_8_ = (Script *)0x0;
          local_168._8_8_ = 0;
          local_168._16_8_ = (_func_int **)0x0;
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2);
          }
          this_01 = (Script *)local_168._0_8_;
          if ((Script *)local_168._0_8_ != (Script *)0x0) {
            operator_delete((void *)local_168._0_8_);
          }
        }
        if (uVar17 < 5) {
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pSVar15 = (Script *)
                    ((long)local_1a8.script_data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start - (long)local_1a8._vptr_Script);
          if (pSVar15 == (Script *)0x0) {
            __dest = (Script *)0x0;
          }
          else {
            if ((long)pSVar15 < 0) {
              ::std::__throw_bad_alloc();
            }
            this_01 = pSVar15;
            __dest = (Script *)operator_new((ulong)pSVar15);
          }
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)&__dest->_vptr_Script + (long)&pSVar15->_vptr_Script);
          __n = (long)local_1a8.script_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start - (long)local_1a8._vptr_Script;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)__dest;
          if (__n != 0) {
            this_01 = __dest;
            local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)__dest;
            memmove(__dest,local_1a8._vptr_Script,__n);
          }
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)(__n + (long)__dest);
          value = ConvertToNumber(this_01,&local_e8);
          ScriptElement::ScriptElement((ScriptElement *)local_168,value,true);
          if (__dest != (Script *)0x0) {
            operator_delete(__dest);
          }
          ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
          push_back(this_00,(ScriptElement *)local_168);
          ScriptElement::~ScriptElement((ScriptElement *)local_168);
        }
        else {
          ByteData::ByteData((ByteData *)&local_90,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a8);
          ScriptElement::ScriptElement((ScriptElement *)local_168,(ByteData *)&local_90);
          ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
          push_back(this_00,(ScriptElement *)local_168);
          ScriptElement::~ScriptElement((ScriptElement *)local_168);
          if (local_90._vptr_ScriptElement != (_func_int **)0x0) {
            operator_delete(local_90._vptr_ScriptElement);
          }
        }
        bVar3 = false;
      }
      uVar14 = (ulong)(uVar17 + uVar16);
      uVar12 = (long)local_1a8.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1a8.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar14 < uVar12);
    if (bVar3) {
      local_168._0_8_ = "cfdcore_script.cpp";
      local_168._8_4_ = 0x3e1;
      local_168._16_8_ = "SetStackData";
      logger::log<>((CfdSourceLocation *)local_168,kCfdLogLevelWarning,"incorrect script data.");
      pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
      local_168._0_8_ = local_168 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,"incorrect script data.","");
      CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_168);
      *(undefined ***)pCVar11 = &PTR__CfdException_006a6458;
      __cxa_throw(pCVar11,&InvalidScriptException::typeinfo,CfdException::~CfdException);
    }
  }
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_100);
  if (local_1a8._vptr_Script != (_func_int **)0x0) {
    operator_delete(local_1a8._vptr_Script);
  }
  if (local_1a8.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Script::SetStackData(const ByteData& bytedata) {
  std::vector<uint8_t> buffer = bytedata.GetBytes();
  static const std::set<ScriptType> kUseScriptNum1{
      kOpCheckSequenceVerify,
      kOpCheckLockTimeVerify,
      kOp1Add,
      kOp1Sub,
      kOpNegate,
      kOpAbs,
      kOpNot,
      kOp0NotEqual,
      kOpPick,
      kOpRoll};
  static const std::set<ScriptType> kUseScriptNum2{
      kOpAdd,
      kOpSub,
      kOpGreaterThan,
      kOpBoolOr,
      kOpNumEqual,
      kOpNumEqualVerify,
      kOpNumNotEqual,
      kOpLessThan,
      kOpBoolAnd,
      kOpLessThanOrEqual,
      kOpMin,
      kOpMax,
      kOpGreaterThanOrEqual};
  static const std::set<ScriptType> kUseScriptNum3{kOpWithIn, kOpCheckSigAdd};

  // create stack
  bool is_collect_buffer = false;
  uint32_t collect_buffer_size = 0;
  std::vector<uint8_t> collect_buffer;
  std::vector<ByteData> top_collect_buffer(2);
  uint32_t offset = 0;
  while (offset < buffer.size()) {
    uint8_t view_data = buffer[offset];
    if (kOp_0 == view_data) {
      // @formatter:off
      ScriptElement script_element = ScriptElement(ScriptOperator::OP_0);
      // @formatter:on
      script_stack_.push_back(script_element);

    } else if (view_data < kOpPushData1) {
      collect_buffer_size = view_data;
      is_collect_buffer = true;
      ++offset;

    } else if (view_data == kOpPushData1) {
      ++offset;
      if ((offset + 1) >= buffer.size()) {
        warn(CFD_LOG_SOURCE, "OP_PUSHDATA1 is incorrect size.");
        throw InvalidScriptException("OP_PUSHDATA1 is incorrect size.");
      }
      collect_buffer_size = buffer[offset];
      is_collect_buffer = true;
      ++offset;

    } else if (view_data == kOpPushData2) {
      ++offset;
      uint16_t ushort_value = 0;
      if ((offset + sizeof(uint16_t)) >= buffer.size()) {
        warn(CFD_LOG_SOURCE, "OP_PUSHDATA2 is incorrect size.");
        throw InvalidScriptException("OP_PUSHDATA2 is incorrect size.");
      }
      // process under LittleEndian
      memcpy(&ushort_value, &buffer[offset], sizeof(ushort_value));
      collect_buffer_size = ushort_value;
      offset += sizeof(ushort_value);
      is_collect_buffer = true;

    } else if (view_data == kOpPushData4) {
      ++offset;
      uint32_t uint_value = 0;
      if ((offset + sizeof(uint_value)) >= buffer.size()) {
        warn(CFD_LOG_SOURCE, "OP_PUSHDATA4 is incorrect size.");
        throw InvalidScriptException("OP_PUSHDATA4 is incorrect size.");
      }
      // process under LittleEndian
      memcpy(&uint_value, &buffer[offset], sizeof(uint_value));
      collect_buffer_size = uint_value;
      offset += sizeof(uint_value);
      is_collect_buffer = true;

    } else {
      // if ((bytedata == OP_0) || ((byteadata >= OP_PUSHDATA1)
      //     && (byteadata <= OP_NOP10)))
      // TODO(k-matsuzawa): Considering script extension, do not perform strict check of OP value.  // NOLINT

      // Setting for ScriptOperator
      ScriptType type = (ScriptType)view_data;
      if (!g_operator_map.empty()) {
        decltype(g_operator_map)::const_iterator ite =
            g_operator_map.find(type);
        if (ite != g_operator_map.end()) {
          ScriptElement script_element = ScriptElement(ite->second);
          script_stack_.push_back(script_element);

          // Since bytedata is stored as numerica type, after decoding bytedata
          // Re-convert to numeric type based on the contents of OP_CODE.
          /// Since OP_CHECKMULTISIG and OP_CHECKMULTISIGVERIFY are
          // in the range of OP_1-OP_16, they are excluded from
          // this conversion process.
          uint32_t convert_count = 0;
          if (kUseScriptNum1.count(type) > 0) {
            if (script_stack_.size() > 1) {
              convert_count = 1;
            }
          } else if (kUseScriptNum2.count(type) > 0) {
            if (script_stack_.size() > 2) {
              convert_count = 2;
            }
          } else if (kUseScriptNum3.count(type) > 0) {
            if (script_stack_.size() > 3) {
              convert_count = 3;
            }
          }

          static constexpr uint32_t kMaxArray = 5;
          if ((convert_count != 0) && (convert_count <= kMaxArray)) {
            int64_t values[kMaxArray];
            uint32_t stack_offset =
                static_cast<uint32_t>(script_stack_.size());
            stack_offset -= convert_count + 1;
            uint32_t check_count = 0;
            for (uint32_t index = 0; index < convert_count; ++index) {
              if (script_stack_[stack_offset + index].ConvertBinaryToNumber(
                      &values[index])) {
                ++check_count;
              }
            }
            if (check_count == convert_count) {
              ScriptElement* pointer = script_stack_.data();
              for (uint32_t index = 0; index < convert_count; ++index) {
                pointer[stack_offset + index] = ScriptElement(values[index]);
              }
            }
          }
        }
      }
    }

    if (is_collect_buffer) {
      collect_buffer.clear();
      collect_buffer.resize(collect_buffer_size);
      auto tmp_collect_buffer_size = collect_buffer_size;
      if ((offset + collect_buffer_size) > buffer.size()) {
        if ((script_stack_.size() >= 2) &&
            (top_collect_buffer[0].GetDataSize() == 3) &&
            (top_collect_buffer[1].GetDataSize() == 4)) {
          // (push past end) If script is coinbase scriptsig, length is low.
          tmp_collect_buffer_size =
              static_cast<uint32_t>(buffer.size()) - offset;
          warn(CFD_LOG_SOURCE, "This script is coinbase scriptsig?");
        } else {
          warn(CFD_LOG_SOURCE, "buffer is incorrect size.");
          throw InvalidScriptException("buffer is incorrect size.");
        }
      }

      // OK
      collect_buffer.assign(
          buffer.begin() + offset,
          buffer.begin() + offset + tmp_collect_buffer_size);

      if (top_collect_buffer.size() > script_stack_.size()) {
        // for coinbase script check
        top_collect_buffer[script_stack_.size()] = ByteData(collect_buffer);
      }
      if (tmp_collect_buffer_size <= kMaxScriptNumSize) {
        ScriptElement script_element =
            ScriptElement(ConvertToNumber(collect_buffer), true);
        script_stack_.push_back(script_element);
      } else {
        ByteData byte_array = ByteData(collect_buffer);
        ScriptElement script_element = ScriptElement(byte_array);
        script_stack_.push_back(script_element);
      }
      offset += tmp_collect_buffer_size;
      is_collect_buffer = false;
    } else {
      ++offset;
    }
  }
  if (is_collect_buffer) {
    // incorrect script
    warn(CFD_LOG_SOURCE, "incorrect script data.");
    throw InvalidScriptException("incorrect script data.");
  }
}